

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseLimitsIndex(WastParser *this,Limits *out_limits)

{
  bool bVar1;
  Enum EVar2;
  Token local_130;
  Token local_f0;
  Type local_ac;
  Token local_a8;
  Token local_68;
  Type local_24;
  Limits *local_20;
  Limits *out_limits_local;
  WastParser *this_local;
  
  local_20 = out_limits;
  out_limits_local = (Limits *)this;
  bVar1 = PeekMatch(this,First_Type);
  if (bVar1) {
    GetToken(&local_68,this);
    local_24 = Token::type(&local_68);
    EVar2 = Type::operator_cast_to_Enum(&local_24);
    if (EVar2 == I64) {
      Consume(&local_a8,this);
      local_20->is_64 = true;
    }
    else {
      GetToken(&local_f0,this);
      local_ac = Token::type(&local_f0);
      EVar2 = Type::operator_cast_to_Enum(&local_ac);
      if (EVar2 == I32) {
        Consume(&local_130,this);
        local_20->is_64 = false;
      }
    }
  }
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseLimitsIndex(Limits* out_limits) {
  WABT_TRACE(ParseLimitsIndex);

  if (PeekMatch(TokenType::ValueType)) {
    if (GetToken().type() == Type::I64) {
      Consume();
      out_limits->is_64 = true;
    } else if (GetToken().type() == Type::I32) {
      Consume();
      out_limits->is_64 = false;
    }
  }

  return Result::Ok;
}